

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionFunctionHandler.cpp
# Opt level: O0

void __thiscall ExpressionFunctionHandler::updateArchitecture(ExpressionFunctionHandler *this)

{
  bool bVar1;
  reference __x;
  Architecture *pAVar2;
  Identifier *name;
  iterator __end1;
  iterator __begin1;
  vector<Identifier,_std::allocator<Identifier>_> *__range1;
  ExpressionFunctionHandler *this_local;
  
  __end1 = std::vector<Identifier,_std::allocator<Identifier>_>::begin(&this->architectureFunctions)
  ;
  name = (Identifier *)
         std::vector<Identifier,_std::allocator<Identifier>_>::end(&this->architectureFunctions);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Identifier_*,_std::vector<Identifier,_std::allocator<Identifier>_>_>
                                *)&name);
    if (!bVar1) break;
    __x = __gnu_cxx::
          __normal_iterator<Identifier_*,_std::vector<Identifier,_std::allocator<Identifier>_>_>::
          operator*(&__end1);
    std::
    map<Identifier,_ExpressionFunctionHandler::Entry,_std::less<Identifier>,_std::allocator<std::pair<const_Identifier,_ExpressionFunctionHandler::Entry>_>_>
    ::erase(&this->entries,__x);
    __gnu_cxx::
    __normal_iterator<Identifier_*,_std::vector<Identifier,_std::allocator<Identifier>_>_>::
    operator++(&__end1);
  }
  std::vector<Identifier,_std::allocator<Identifier>_>::clear(&this->architectureFunctions);
  this->registeringArchitecture = true;
  pAVar2 = Architecture::current();
  (*pAVar2->_vptr_Architecture[2])(pAVar2,this);
  this->registeringArchitecture = false;
  return;
}

Assistant:

void ExpressionFunctionHandler::updateArchitecture()
{
	// remove functions of previous architecture
	for (const auto &name : architectureFunctions)
	{
		entries.erase(name);
	}

	architectureFunctions.clear();

	// Add functions of current architecture. Remember functions that were added
	registeringArchitecture = true;
	Architecture::current().registerExpressionFunctions(*this);
	registeringArchitecture = false;
}